

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::TestRunInfo> * __thiscall
Catch::Option<Catch::TestRunInfo>::operator=(Option<Catch::TestRunInfo> *this,TestRunInfo *_value)

{
  TestRunInfo *_value_local;
  Option<Catch::TestRunInfo> *this_local;
  
  reset(this);
  TestRunInfo::TestRunInfo((TestRunInfo *)this->storage,_value);
  this->nullableValue = (TestRunInfo *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }